

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O0

void do_work(int type,int op)

{
  undefined4 in_ESI;
  GlobalArray *unaff_R14;
  int hi [2];
  int lo [2];
  int vdim;
  int dims [2];
  int n;
  GlobalArray *g_v;
  GlobalArray *g_m;
  GlobalArray *g_c;
  GlobalArray *g_b;
  GlobalArray *g_a;
  GlobalArray *in_stack_00000168;
  GlobalArray *in_stack_00000170;
  GlobalArray *in_stack_00000178;
  GlobalArray *in_stack_00000180;
  GlobalArray *in_stack_00000188;
  GlobalArray *in_stack_00000190;
  int *in_stack_00000198;
  int *in_stack_000001a0;
  GlobalArray *in_stack_000001a8;
  int *in_stack_000001b0;
  int *in_stack_000001b8;
  GlobalArray *in_stack_000001c0;
  GlobalArray *in_stack_000001f0;
  int *in_stack_000001f8;
  int *in_stack_00000200;
  GlobalArray *in_stack_00000208;
  int *in_stack_00000210;
  int *in_stack_00000218;
  char *in_stack_ffffffffffffff48;
  GAServices *in_stack_ffffffffffffff50;
  GlobalArray *this;
  int *in_stack_ffffffffffffff60;
  GlobalArray *in_stack_ffffffffffffff68;
  GAServices *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  GlobalArray local_64;
  undefined4 local_60;
  int local_5c;
  undefined8 local_58;
  undefined4 local_4c;
  GlobalArray *local_48;
  GlobalArray *local_40;
  GlobalArray *local_38;
  GlobalArray *local_30;
  GlobalArray *local_28;
  
  local_4c = 4;
  local_58 = 0x600000004;
  local_64.mHandle = 1;
  local_60 = 1;
  switch(in_ESI) {
  case 1:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    test_shift_diagonal((GlobalArray *)dims);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 2:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_5c = local_58._4_4_;
    if ((int)local_58 <= local_58._4_4_) {
      local_5c = (int)local_58;
    }
    local_48 = GA::GAServices::createGA
                         ((GAServices *)CONCAT44(local_5c,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    test_set_diagonal(g_c,g_m);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 3:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_5c = local_58._4_4_;
    if ((int)local_58 <= local_58._4_4_) {
      local_5c = (int)local_58;
    }
    local_48 = GA::GAServices::createGA
                         ((GAServices *)CONCAT44(in_stack_ffffffffffffff84,local_5c),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    test_add_diagonal(g_c,g_m);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 4:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_5c = local_58._4_4_;
    if ((int)local_58 <= local_58._4_4_) {
      local_5c = (int)local_58;
    }
    local_48 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),local_5c,
                          in_stack_ffffffffffffff78,(int *)in_stack_ffffffffffffff70,
                          (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    test_get_diagonal(g_c,g_m);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 5:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    if (local_28 == (GlobalArray *)0x0) {
      GA_Error((char *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    }
    test_norm1(unaff_R14);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 6:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    test_norm_infinity(unaff_R14);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 7:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_30 = GA::GAServices::createGA
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (char *)in_stack_ffffffffffffff60);
    local_38 = GA::GAServices::createGA
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (char *)in_stack_ffffffffffffff60);
    test_median(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 8:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_30 = GA::GAServices::createGA
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (char *)in_stack_ffffffffffffff60);
    local_38 = GA::GAServices::createGA
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (char *)in_stack_ffffffffffffff60);
    local_40 = GA::GAServices::createGA
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (char *)in_stack_ffffffffffffff60);
    this = &local_64;
    test_median_patch(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,in_stack_000001a8,
                      in_stack_000001a0,in_stack_00000198,in_stack_000001f0,in_stack_000001f8,
                      in_stack_00000200,in_stack_00000208,in_stack_00000210,in_stack_00000218);
    GA::GlobalArray::destroy(this);
    GA::GlobalArray::destroy(this);
    GA::GlobalArray::destroy(this);
    GA::GlobalArray::destroy(this);
    break;
  case 9:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_5c = (int)local_58;
    local_48 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    test_scale_rows(in_stack_00000190,in_stack_00000188);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  case 10:
    local_28 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    local_5c = local_58._4_4_;
    local_48 = GA::GAServices::createGA
                         ((GAServices *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
                          (int *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60);
    test_scale_cols(in_stack_00000190,in_stack_00000188);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    GA::GlobalArray::destroy((GlobalArray *)in_stack_ffffffffffffff50);
    break;
  default:
    GA::GAServices::error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,0);
  }
  return;
}

Assistant:

void
do_work (int type, int op) {
  GA::GlobalArray *g_a, *g_b, *g_c, *g_m, *g_v;
  int n = N;
  int dims[2] = { N,		/*N columns */
		  N + 2		/*N+2 rows */
  };
  int vdim;
  int lo[2], hi[2];

  lo[0] = 1;
  hi[0] = dims[0] - 1;
  lo[1] = 1;
  hi[1] = dims[1] - 1;

  switch (op)
    {

    case OP_SHIFT_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      test_shift_diagonal (g_a);
      g_a->destroy();
      break;
    case OP_SET_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = GA_MIN (dims[0], dims[1]);
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_set_diagonal (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_ADD_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = GA_MIN (dims[0], dims[1]);
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_add_diagonal (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_GET_DIAGONAL:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = GA_MIN (dims[0], dims[1]);
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_get_diagonal (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_NORM1:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      if (!g_a)
	GA_Error ((char *)"create failed: A", n);
      test_norm1 (g_a);
      g_a->destroy ();
      break;

    case OP_NORM_INFINITY:
      g_a = GA::SERVICES.createGA (type, 2, dims,(char *) "A", NULL);
      test_norm_infinity (g_a);
      g_a->destroy ();
      break;

    case OP_MEDIAN:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*duplicate g_a */
      g_b = GA::SERVICES.createGA (g_a, (char *)"B");      
      g_c = GA::SERVICES.createGA (g_a, (char *)"C");
#if 0 //test g_m is different from g_a, g_b, amd g_c
      g_m = GA::SERVICES.createGA (g_a, (char *)"M");
      test_median (g_a, g_b, g_c, g_m);
#else //test g_m = g_c
      test_median (g_a, g_b, g_c, g_a);
#endif
      g_a->destroy ();
      g_b->destroy ();
      g_c->destroy ();
#if 0 //test g_m is different from g_a, g_b, g_c
      g_m->destroy ();
#endif
      break;

    case OP_MEDIAN_PATCH:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*duplicate g_a */
      g_b = GA::SERVICES.createGA (g_a, (char *)"B");
      g_c = GA::SERVICES.createGA (g_a, (char *)"C");
      g_m = GA::SERVICES.createGA (g_a, (char *)"M");
      test_median_patch (g_a, lo, hi, g_b, lo, hi, g_c, lo, hi, g_m, lo, hi);
      g_a->destroy ();
      g_b->destroy ();
      g_c->destroy ();
      g_m->destroy ();
      break;
    case OP_SCALE_ROWS:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = dims[0];
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_scale_rows (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;
    case OP_SCALE_COLS:
      g_a = GA::SERVICES.createGA (type, 2, dims, (char *)"A", NULL);
      /*find out the diagonal length of the matrix A */
      vdim = dims[1];
      g_v = GA::SERVICES.createGA (type, 1, &vdim, (char *)"V", NULL);
      test_scale_cols (g_a, g_v);
      g_a->destroy ();
      g_v->destroy ();
      break;

    default:
      GA::SERVICES.error ((char *)"test_function: wrong operation.", op);
    }
}